

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void icetSendRecvLargeMessages
               (IceTInt numMessagesSending,IceTInt *messageDestinations,IceTBoolean messagesInOrder,
               IceTGenerateData generateDataFunc,IceTHandleData handleDataFunc,
               IceTVoid *incomingBuffer,IceTSizeType bufferSize)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  IceTInt *pIVar4;
  IceTInt *pIVar5;
  IceTInt *sendIds_00;
  void *sendbuf;
  void *recvbuf;
  IceTInt *__ptr;
  IceTInt *__ptr_00;
  void *__ptr_01;
  undefined8 uVar6;
  IceTVoid *data;
  IceTSizeType data_size;
  IceTInt p;
  IceTInt right;
  IceTInt left;
  IceTInt receiver;
  char *localDests;
  IceTCommRequest requests [2];
  IceTInt *recvFrom;
  IceTInt *recvQueue;
  IceTInt *sendQueue;
  IceTByte *allDests;
  IceTByte *myDests;
  IceTInt *sendIds;
  IceTInt *process_orders;
  IceTInt *composite_order;
  IceTInt rqi;
  IceTInt sqi;
  IceTInt sendToSelf;
  IceTInt someoneSends;
  IceTInt numRecv;
  IceTInt numSend;
  IceTInt sender;
  IceTInt i;
  IceTInt rank;
  IceTInt comm_size;
  IceTVoid *incomingBuffer_local;
  IceTHandleData handleDataFunc_local;
  IceTGenerateData generateDataFunc_local;
  IceTInt *pIStack_18;
  IceTBoolean messagesInOrder_local;
  IceTInt *messageDestinations_local;
  IceTInt numMessagesSending_local;
  
  _rank = incomingBuffer;
  incomingBuffer_local = handleDataFunc;
  handleDataFunc_local = (IceTHandleData)generateDataFunc;
  generateDataFunc_local._7_1_ = messagesInOrder;
  pIStack_18 = messageDestinations;
  messageDestinations_local._4_4_ = numMessagesSending;
  icetGetIntegerv(3,&i);
  icetGetIntegerv(2,&sender);
  pIVar4 = icetUnsafeStateGetInteger(0x29);
  pIVar5 = icetUnsafeStateGetInteger(0x2a);
  sendIds_00 = (IceTInt *)malloc((long)i << 2);
  sendbuf = malloc((long)i);
  recvbuf = malloc((long)(i * i));
  __ptr = (IceTInt *)malloc((long)i << 2);
  __ptr_00 = (IceTInt *)malloc((long)i << 2);
  __ptr_01 = malloc((long)i << 2);
  for (numSend = 0; numSend < i; numSend = numSend + 1) {
    *(undefined1 *)((long)sendbuf + (long)numSend) = 0;
  }
  for (numSend = 0; numSend < messageDestinations_local._4_4_; numSend = numSend + 1) {
    *(undefined1 *)((long)sendbuf + (long)pIStack_18[numSend]) = 1;
    sendIds_00[pIStack_18[numSend]] = numSend;
  }
  cVar1 = *(char *)((long)sendbuf + (long)sender);
  *(undefined1 *)((long)sendbuf + (long)sender) = 0;
  icetCommAllgather(sendbuf,i,0x8001,recvbuf);
  someoneSends = 0;
  sendToSelf = 0;
  do {
    bVar2 = false;
    for (numSend = 0; numSend < i; numSend = numSend + 1) {
      *(undefined4 *)((long)__ptr_01 + (long)numSend * 4) = 0xffffffff;
    }
    for (numRecv = 0; numRecv < i; numRecv = numRecv + 1) {
      for (right = 0; right < i; right = right + 1) {
        if ((*(char *)((long)recvbuf + (long)right + (long)(numRecv * i)) != '\0') &&
           (*(int *)((long)__ptr_01 + (long)right * 4) < 0)) {
          if (generateDataFunc_local._7_1_ != '\0') {
            if (pIVar5[numRecv] < pIVar5[right]) {
              p = pIVar5[numRecv];
              data_size = pIVar5[right];
            }
            else {
              p = pIVar5[right];
              data_size = pIVar5[numRecv];
            }
            do {
              p = p + 1;
              if (data_size <= p) break;
            } while (*(char *)((long)recvbuf + (long)(pIVar4[p] * i + right)) == '\0');
            if (p != data_size) goto LAB_001258ca;
          }
          *(undefined1 *)((long)recvbuf + (long)right + (long)(numRecv * i)) = 0;
          *(IceTInt *)((long)__ptr_01 + (long)right * 4) = numRecv;
          if (numRecv == sender) {
            __ptr[someoneSends] = right;
            someoneSends = someoneSends + 1;
          }
          bVar2 = true;
          break;
        }
LAB_001258ca:
      }
    }
    if (-1 < *(int *)((long)__ptr_01 + (long)sender * 4)) {
      __ptr_00[sendToSelf] = *(IceTInt *)((long)__ptr_01 + (long)sender * 4);
      sendToSelf = sendToSelf + 1;
    }
    if (!bVar2) {
      composite_order._4_4_ = 0;
      composite_order._0_4_ = 0;
      if (sendToSelf < 1) {
        localDests = (char *)0x0;
      }
      else {
        startLargeRecv(_rank,bufferSize,*__ptr_00,(IceTCommRequest *)&localDests);
      }
      if (cVar1 != '\0') {
        uVar6 = (*handleDataFunc_local)((void *)sendIds_00[sender],sender);
        (*(code *)incomingBuffer_local)(uVar6,sender);
      }
      if (someoneSends < 1) {
        requests[0] = (IceTCommRequest)0x0;
      }
      else {
        startLargeSend(*__ptr,requests,(IceTGenerateData)handleDataFunc_local,sendIds_00);
      }
      while ((int)composite_order < sendToSelf || composite_order._4_4_ < someoneSends) {
        iVar3 = icetCommWaitany(2,(IceTCommRequest *)&localDests);
        if (iVar3 == 0) {
          (*(code *)incomingBuffer_local)(_rank,__ptr_00[(int)composite_order]);
          composite_order._0_4_ = (int)composite_order + 1;
          if ((int)composite_order < sendToSelf) {
            startLargeRecv(_rank,bufferSize,__ptr_00[(int)composite_order],
                           (IceTCommRequest *)&localDests);
          }
        }
        else if ((iVar3 == 1) &&
                (composite_order._4_4_ = composite_order._4_4_ + 1,
                composite_order._4_4_ < someoneSends)) {
          startLargeSend(__ptr[composite_order._4_4_],requests,
                         (IceTGenerateData)handleDataFunc_local,sendIds_00);
        }
      }
      free(sendIds_00);
      free(sendbuf);
      free(recvbuf);
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      return;
    }
  } while( true );
}

Assistant:

void icetSendRecvLargeMessages(IceTInt numMessagesSending,
                               IceTInt *messageDestinations,
                               IceTBoolean messagesInOrder,
                               IceTGenerateData generateDataFunc,
                               IceTHandleData handleDataFunc,
                               IceTVoid *incomingBuffer,
                               IceTSizeType bufferSize)
{
    IceTInt comm_size;
    IceTInt rank;
    IceTInt i;
    IceTInt sender;
    IceTInt numSend, numRecv;
    IceTInt someoneSends;
    IceTInt sendToSelf;
    IceTInt sqi, rqi;     /* Send/Recv queue index. */
    const IceTInt *composite_order;
    const IceTInt *process_orders;

    IceTInt *sendIds;
    IceTByte *myDests;
    IceTByte *allDests;
    IceTInt *sendQueue;
    IceTInt *recvQueue;
    IceTInt *recvFrom;

#define RECV_IDX 0
#define SEND_IDX 1
    IceTCommRequest requests[2];

    icetGetIntegerv(ICET_NUM_PROCESSES, &comm_size);
    icetGetIntegerv(ICET_RANK, &rank);

    composite_order = icetUnsafeStateGetInteger(ICET_COMPOSITE_ORDER);
    process_orders = icetUnsafeStateGetInteger(ICET_PROCESS_ORDERS);

    /* Allocate structures that manage who sends to what.
       YIKES, that allDests can get really big.  We will have to work around
       that in order to run on supercomputers.  (It is generally used for
       tiled displays.) */
    sendIds = malloc(comm_size * sizeof(IceTInt));
    myDests = malloc(comm_size);
    allDests = malloc(comm_size * comm_size);
    sendQueue = malloc(comm_size * sizeof(IceTInt));
    recvQueue = malloc(comm_size * sizeof(IceTInt));
    recvFrom = malloc(comm_size * sizeof(IceTInt));

  /* Convert array of ranks to a mask of ranks. */
    for (i = 0; i < comm_size; i++) {
        myDests[i] = 0;
    }
    for (i = 0; i < numMessagesSending; i++) {
        myDests[messageDestinations[i]] = 1;
        sendIds[messageDestinations[i]] = i;
    }

  /* We'll just handle send to self as a special case. */
    sendToSelf = myDests[rank];
    myDests[rank] = 0;

  /* Gather masks for all processes. */
    icetCommAllgather(myDests, comm_size, ICET_BYTE, allDests);

  /* Determine communications.  We will determine communications in a
     series of steps.  At each step, we will try to find the most send/recv
     pairs.  Each step will be able to complete without deadlock.  Rather
     than saving the sends and recieves per step, we will simply push them
     into queues and run the send and receive queues in parallel later. */
    numSend = 0;  numRecv = 0;
    do {
        someoneSends = 0;
      /* We are going to keep track of what every processor receives to
         ensure that no processor receives more than one message per
         iteration.  Clear out the array first. */
        for (i = 0; i < comm_size; i++) recvFrom[i] = -1;
      /* Try to find a destination for each sender. */
        for (sender = 0; sender < comm_size; sender++) {
            char *localDests = allDests + sender*comm_size;
            IceTInt receiver;
            for (receiver = 0; receiver < comm_size; receiver++) {
                if (localDests[receiver] && (recvFrom[receiver] < 0)) {
                    if (messagesInOrder) {
                      /* Make sure there is not another message that must
                         be sent first. */
                        IceTInt left, right;
                        if (process_orders[sender] < process_orders[receiver]) {
                            left = process_orders[sender];
                            right = process_orders[receiver];
                        } else {
                            left = process_orders[receiver];
                            right = process_orders[sender];
                        }
                        for (left++; left < right; left++) {
                            IceTInt p = composite_order[left];
                            if (allDests[p*comm_size + receiver]) break;
                        }
                        if (left != right) {
                          /* We have to wait for someone else to send
                             before we can send this one. */
                            continue;
                        }
                    }
                    localDests[receiver] = 0;
                  /* This is no longer necessary since we take care of
                     sentToSelf above
                     
                    if (sender == receiver) {
                        if (rank == sender) sendToSelf = 1;
                        continue;
                    }
                  */
                    recvFrom[receiver] = sender;
                    if (sender == rank) {
                        sendQueue[numSend++] = receiver;
                    }
                    someoneSends = 1;
                    break;
                }
            }
        }
      /* Check to see if we are receiving something this iteration. */
        if (recvFrom[rank] >= 0) {
            recvQueue[numRecv++] = recvFrom[rank];
        }
    } while (someoneSends);
#ifdef DEBUG
    for (i = 0; i < comm_size*comm_size; i++) {
        if (allDests[i] != 0) {
            icetRaiseError("Apperent deadlock encountered.",
                           ICET_SANITY_CHECK_FAIL);
        }
    }
#endif

    sqi = 0;  rqi = 0;
    if (rqi < numRecv) {
        icetRaiseDebug1("Receiving from %d", (int)recvQueue[rqi]);
        startLargeRecv(incomingBuffer, bufferSize, recvQueue[rqi],
                       &requests[RECV_IDX]);
    } else {
        requests[RECV_IDX] = ICET_COMM_REQUEST_NULL;
    }
    if (sendToSelf) {
        IceTSizeType data_size;
        IceTVoid *data;
        icetRaiseDebug("Sending to self.");
        data = (*generateDataFunc)(sendIds[rank], rank, &data_size);
        (*handleDataFunc)(data, rank);
    }
    if (sqi < numSend) {
        icetRaiseDebug1("Sending to %d", (int)sendQueue[sqi]);
        startLargeSend(sendQueue[sqi], &requests[SEND_IDX],
                       generateDataFunc, sendIds);
    } else {
        requests[SEND_IDX] = ICET_COMM_REQUEST_NULL;
    }
    while ((rqi < numRecv) || (sqi < numSend)) {
        icetRaiseDebug("Starting wait.");
        i = icetCommWaitany(2, requests);
        icetRaiseDebug1("Wait returned with %d finished.", (int)i);
        switch (i) {
          case RECV_IDX:
              icetRaiseDebug1("Receive from %d finished", (int)recvQueue[rqi]);
              (*handleDataFunc)(incomingBuffer, recvQueue[rqi]);
              rqi++;
              if (rqi < numRecv) {
                  icetRaiseDebug1("Receiving from %d", (int)recvQueue[rqi]);
                  startLargeRecv(incomingBuffer, bufferSize, recvQueue[rqi],
                                 &requests[RECV_IDX]);
              }
              continue;
          case SEND_IDX:
              icetRaiseDebug1("Send to %d finished", (int)sendQueue[sqi]);
              sqi++;
              if (sqi < numSend) {
                  icetRaiseDebug1("Sending to %d", (int)sendQueue[sqi]);
                  startLargeSend(sendQueue[sqi], &requests[SEND_IDX],
                                 generateDataFunc, sendIds);
              }
              continue;
        }
    }

    free(sendIds);
    free(myDests);
    free(allDests);
    free(sendQueue);
    free(recvQueue);
    free(recvFrom);
}